

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O0

void start_output_ppm(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo)

{
  int iVar1;
  long in_RSI;
  long *in_RDI;
  ppm_dest_ptr dest;
  
  iVar1 = (int)in_RDI[8];
  if (iVar1 == 1) {
    fprintf(*(FILE **)(in_RSI + 0x20),"P5\n%ld %ld\n%d\n",(ulong)*(uint *)(in_RDI + 0x11),
            (ulong)*(uint *)((long)in_RDI + 0x8c),0xff);
  }
  else if (((iVar1 == 2) || (iVar1 == 4)) || (iVar1 - 6U < 10)) {
    if ((((int)in_RDI[8] != 2) && ((*(uint *)(in_RDI + 8) < 6 || (0xf < *(uint *)(in_RDI + 8))))) &&
       (*(int *)((long)in_RDI + 0x6c) != 0)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x404;
      (**(code **)*in_RDI)(in_RDI);
    }
    fprintf(*(FILE **)(in_RSI + 0x20),"P6\n%ld %ld\n%d\n",(ulong)*(uint *)(in_RDI + 0x11),
            (ulong)*(uint *)((long)in_RDI + 0x8c),0xff);
  }
  else {
    *(undefined4 *)(*in_RDI + 0x28) = 0x404;
    (**(code **)*in_RDI)(in_RDI);
  }
  return;
}

Assistant:

METHODDEF(void)
start_output_ppm(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;

  /* Emit file header */
  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    /* emit header for raw PGM format */
    fprintf(dest->pub.output_file, "P5\n%ld %ld\n%d\n",
            (long)cinfo->output_width, (long)cinfo->output_height, PPM_MAXVAL);
    break;
  case JCS_RGB:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
  case JCS_CMYK:
    if (!IsExtRGB(cinfo->out_color_space) && cinfo->quantize_colors)
      ERREXIT(cinfo, JERR_PPM_COLORSPACE);
    /* emit header for raw PPM format */
    fprintf(dest->pub.output_file, "P6\n%ld %ld\n%d\n",
            (long)cinfo->output_width, (long)cinfo->output_height, PPM_MAXVAL);
    break;
  default:
    ERREXIT(cinfo, JERR_PPM_COLORSPACE);
  }
}